

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderPieSlice
               (ImDrawList *DrawList,ImPlotPoint *center,double radius,double a0,double a1,ImU32 col
               )

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  ImVec2 IVar9;
  
  if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer ==
      '\0') {
    iVar4 = __cxa_guard_acquire(&RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                                 ::buffer);
    if (iVar4 != 0) {
      memset(RenderPieSlice::buffer,0,400);
      __cxa_guard_release(&RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                           ::buffer);
    }
  }
  RenderPieSlice::buffer[0] = PlotToPixels(center,-1);
  uVar3 = (uint)((a1 - a0) * 7.957746982574463);
  uVar6 = 3;
  if (3 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar7 = (double)(int)uVar5 * ((a1 - a0) / (double)((int)uVar6 + -1)) + a0;
    dVar1 = center->x;
    dVar8 = cos(dVar7);
    dVar2 = center->y;
    dVar7 = sin(dVar7);
    IVar9 = PlotToPixels(dVar8 * radius + dVar1,dVar2 + dVar7 * radius,-1);
    RenderPieSlice::buffer[uVar5 + 1] = IVar9;
  }
  ImDrawList::AddConvexPolyFilled(DrawList,RenderPieSlice::buffer,(int)uVar6 + 1,col);
  return;
}

Assistant:

inline void RenderPieSlice(ImDrawList& DrawList, const ImPlotPoint& center, double radius, double a0, double a1, ImU32 col) {
    static const float resolution = 50 / (2 * IM_PI);
    static ImVec2 buffer[50];
    buffer[0] = PlotToPixels(center);
    int n = ImMax(3, (int)((a1 - a0) * resolution));
    double da = (a1 - a0) / (n - 1);
    for (int i = 0; i < n; ++i) {
        double a = a0 + i * da;
        buffer[i + 1] = PlotToPixels(center.x + radius * cos(a), center.y + radius * sin(a));
    }
    DrawList.AddConvexPolyFilled(buffer, n + 1, col);
}